

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

ssize_t __thiscall Image::write(Image *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  vector<int,_std::allocator<int>_> local_c8;
  _InputArray local_b0;
  __cxx11 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string path;
  Mat *image_local;
  int *iteration_local;
  string *filename_local;
  Image *this_local;
  
  std::__cxx11::to_string(local_88,*__buf);
  std::operator+((char *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"../results/")
  ;
  std::operator+(local_48,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  cv::_InputArray::_InputArray(&local_b0,(Mat *)__n);
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8);
  cv::imwrite((string *)local_48,&local_b0,(vector *)&local_c8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c8);
  cv::_InputArray::~_InputArray(&local_b0);
  sVar1 = std::__cxx11::string::~string((string *)local_48);
  return sVar1;
}

Assistant:

void Image::write(std::string filename,  const int &iteration, const cv::Mat& image) {
    std::string path = "../results/"+ std::to_string(iteration)  + filename;
    cv::imwrite(path, image);
}